

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O2

void __thiscall
RegisterCLParserTestDuplicatedHeader::RegisterCLParserTestDuplicatedHeader
          (RegisterCLParserTestDuplicatedHeader *this)

{
  RegisterTest(CLParserTestDuplicatedHeader::Create,"CLParserTest.DuplicatedHeader");
  return;
}

Assistant:

TEST(CLParserTest, DuplicatedHeader) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "Note: including file: foo.h\r\n"
      "Note: including file: bar.h\r\n"
      "Note: including file: foo.h\r\n",
      "", &output, &err));
  // We should have dropped one copy of foo.h.
  ASSERT_EQ("", output);
  ASSERT_EQ(2u, parser.includes_.size());
}